

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteSweepShadingPatternObject
          (ShadingWriter *this,double inCX,double inCY,double inStartAngleRad,double inEndAngleRad,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  SweepShading sweepParams;
  SweepShading local_70;
  
  local_70.cX = inCX;
  local_70.cY = inCY;
  local_70.startAngleRad = inStartAngleRad;
  local_70.endAngleRad = inEndAngleRad;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (&local_70.colorLine,inColorLine);
  p_Var2 = (inColorLine->
           super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_70.gradientExtend = inGradientExtend;
  if (p_Var2 != (_List_node_base *)inColorLine) {
    do {
      if (((double)p_Var2[1]._M_prev != 1.0) || (NAN((double)p_Var2[1]._M_prev))) {
        bVar3 = false;
      }
      else {
        bVar3 = *(char *)((long)(p_Var2 + 1 + 1) + 3) == -1;
      }
    } while ((bVar3) &&
            (p_Var2 = (((_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>
                         *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var2 != (_List_node_base *)inColorLine));
    if (!bVar3) {
      EVar1 = WriteRGBATiledPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
      goto joined_r0x001e8ead;
    }
  }
  EVar1 = WriteShadingPatternObjectWithPDFCustomFunctions
                    (this,&local_70,inBounds,inMatrix,inPatternObjectId);
joined_r0x001e8ead:
  while (local_70.colorLine.
         super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl
         ._M_node.super__List_node_base._M_next != (_List_node_base *)&local_70.colorLine) {
    p_Var2 = (local_70.colorLine.
              super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>.
              _M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_70.colorLine.
                    super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x28);
    local_70.colorLine.
    super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
    _M_node.super__List_node_base._M_next = p_Var2;
  }
  return EVar1;
}

Assistant:

EStatusCode ShadingWriter::WriteSweepShadingPatternObject(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId) {

    // Note: at this point start and end angles are ignored. 0..360 is the range used at all times.
    // As a side effect this also means there's no support for extend, as the full range is always implemented.
    SweepShading sweepParams = {
        inCX,
        inCY,
        inStartAngleRad,
        inEndAngleRad,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);

}